

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRboStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_1::RboInternalFormatCase::test(RboInternalFormatCase *this)

{
  int local_24;
  GLenum GStack_20;
  int ndx;
  GLenum requiredColorformats [3];
  GLuint renderbufferID;
  RboInternalFormatCase *this_local;
  
  requiredColorformats[1] = 0;
  unique0x10000266 = this;
  glu::CallLogWrapper::glGenRenderbuffers
            (&(this->super_ApiCase).super_CallLogWrapper,1,requiredColorformats + 1);
  glu::CallLogWrapper::glBindRenderbuffer
            (&(this->super_ApiCase).super_CallLogWrapper,0x8d41,requiredColorformats[1]);
  ApiCase::expectError(&this->super_ApiCase,0);
  checkRenderbufferParam
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             &(this->super_ApiCase).super_CallLogWrapper,0x8d44,0x8056);
  ApiCase::expectError(&this->super_ApiCase,0);
  _GStack_20 = 0x805700008056;
  requiredColorformats[0] = 0x8d62;
  for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
    glu::CallLogWrapper::glRenderbufferStorage
              (&(this->super_ApiCase).super_CallLogWrapper,0x8d41,(&GStack_20)[local_24],1,1);
    ApiCase::expectError(&this->super_ApiCase,0);
    checkRenderbufferParam
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               &(this->super_ApiCase).super_CallLogWrapper,0x8d44,(&GStack_20)[local_24]);
  }
  glu::CallLogWrapper::glDeleteRenderbuffers
            (&(this->super_ApiCase).super_CallLogWrapper,1,requiredColorformats + 1);
  return;
}

Assistant:

void test (void)
	{
		GLuint renderbufferID = 0;
		glGenRenderbuffers(1, &renderbufferID);
		glBindRenderbuffer(GL_RENDERBUFFER, renderbufferID);
		expectError(GL_NO_ERROR);

		checkRenderbufferParam(m_testCtx, *this, GL_RENDERBUFFER_INTERNAL_FORMAT, GL_RGBA4);
		expectError(GL_NO_ERROR);

		const GLenum requiredColorformats[] =
		{
			GL_RGBA4, GL_RGB5_A1, GL_RGB565
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(requiredColorformats); ++ndx)
		{
			glRenderbufferStorage(GL_RENDERBUFFER, requiredColorformats[ndx], 1, 1);
			expectError(GL_NO_ERROR);

			checkRenderbufferParam(m_testCtx, *this, GL_RENDERBUFFER_INTERNAL_FORMAT, requiredColorformats[ndx]);
		}

		glDeleteRenderbuffers(1, &renderbufferID);
	}